

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O2

int XmlRpc::XmlRpcSocket::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  socklen_t __len_00;
  ushort uVar2;
  sockaddr_storage ss;
  
  ss.__ss_padding[0x6e] = '\0';
  ss.__ss_padding[0x6f] = '\0';
  ss.__ss_padding[0x70] = '\0';
  ss.__ss_padding[0x71] = '\0';
  ss.__ss_padding[0x72] = '\0';
  ss.__ss_padding[0x73] = '\0';
  ss.__ss_padding[0x74] = '\0';
  ss.__ss_padding[0x75] = '\0';
  ss.__ss_align = 0;
  ss.__ss_padding[0x5e] = '\0';
  ss.__ss_padding[0x5f] = '\0';
  ss.__ss_padding[0x60] = '\0';
  ss.__ss_padding[0x61] = '\0';
  ss.__ss_padding[0x62] = '\0';
  ss.__ss_padding[99] = '\0';
  ss.__ss_padding[100] = '\0';
  ss.__ss_padding[0x65] = '\0';
  ss.__ss_padding[0x66] = '\0';
  ss.__ss_padding[0x67] = '\0';
  ss.__ss_padding[0x68] = '\0';
  ss.__ss_padding[0x69] = '\0';
  ss.__ss_padding[0x6a] = '\0';
  ss.__ss_padding[0x6b] = '\0';
  ss.__ss_padding[0x6c] = '\0';
  ss.__ss_padding[0x6d] = '\0';
  ss.__ss_padding[0x4e] = '\0';
  ss.__ss_padding[0x4f] = '\0';
  ss.__ss_padding[0x50] = '\0';
  ss.__ss_padding[0x51] = '\0';
  ss.__ss_padding[0x52] = '\0';
  ss.__ss_padding[0x53] = '\0';
  ss.__ss_padding[0x54] = '\0';
  ss.__ss_padding[0x55] = '\0';
  ss.__ss_padding[0x56] = '\0';
  ss.__ss_padding[0x57] = '\0';
  ss.__ss_padding[0x58] = '\0';
  ss.__ss_padding[0x59] = '\0';
  ss.__ss_padding[0x5a] = '\0';
  ss.__ss_padding[0x5b] = '\0';
  ss.__ss_padding[0x5c] = '\0';
  ss.__ss_padding[0x5d] = '\0';
  ss.__ss_padding[0x3e] = '\0';
  ss.__ss_padding[0x3f] = '\0';
  ss.__ss_padding[0x40] = '\0';
  ss.__ss_padding[0x41] = '\0';
  ss.__ss_padding[0x42] = '\0';
  ss.__ss_padding[0x43] = '\0';
  ss.__ss_padding[0x44] = '\0';
  ss.__ss_padding[0x45] = '\0';
  ss.__ss_padding[0x46] = '\0';
  ss.__ss_padding[0x47] = '\0';
  ss.__ss_padding[0x48] = '\0';
  ss.__ss_padding[0x49] = '\0';
  ss.__ss_padding[0x4a] = '\0';
  ss.__ss_padding[0x4b] = '\0';
  ss.__ss_padding[0x4c] = '\0';
  ss.__ss_padding[0x4d] = '\0';
  ss.__ss_padding[0x2e] = '\0';
  ss.__ss_padding[0x2f] = '\0';
  ss.__ss_padding[0x30] = '\0';
  ss.__ss_padding[0x31] = '\0';
  ss.__ss_padding[0x32] = '\0';
  ss.__ss_padding[0x33] = '\0';
  ss.__ss_padding[0x34] = '\0';
  ss.__ss_padding[0x35] = '\0';
  ss.__ss_padding[0x36] = '\0';
  ss.__ss_padding[0x37] = '\0';
  ss.__ss_padding[0x38] = '\0';
  ss.__ss_padding[0x39] = '\0';
  ss.__ss_padding[0x3a] = '\0';
  ss.__ss_padding[0x3b] = '\0';
  ss.__ss_padding[0x3c] = '\0';
  ss.__ss_padding[0x3d] = '\0';
  ss.__ss_padding[0x1e] = '\0';
  ss.__ss_padding[0x1f] = '\0';
  ss.__ss_padding[0x20] = '\0';
  ss.__ss_padding[0x21] = '\0';
  ss.__ss_padding[0x22] = '\0';
  ss.__ss_padding[0x23] = '\0';
  ss.__ss_padding[0x24] = '\0';
  ss.__ss_padding[0x25] = '\0';
  ss.__ss_padding[0x26] = '\0';
  ss.__ss_padding[0x27] = '\0';
  ss.__ss_padding[0x28] = '\0';
  ss.__ss_padding[0x29] = '\0';
  ss.__ss_padding[0x2a] = '\0';
  ss.__ss_padding[0x2b] = '\0';
  ss.__ss_padding[0x2c] = '\0';
  ss.__ss_padding[0x2d] = '\0';
  ss.__ss_padding[0xe] = '\0';
  ss.__ss_padding[0xf] = '\0';
  ss.__ss_padding[0x10] = '\0';
  ss.__ss_padding[0x11] = '\0';
  ss.__ss_padding[0x12] = '\0';
  ss.__ss_padding[0x13] = '\0';
  ss.__ss_padding[0x14] = '\0';
  ss.__ss_padding[0x15] = '\0';
  ss.__ss_padding[0x16] = '\0';
  ss.__ss_padding[0x17] = '\0';
  ss.__ss_padding[0x18] = '\0';
  ss.__ss_padding[0x19] = '\0';
  ss.__ss_padding[0x1a] = '\0';
  ss.__ss_padding[0x1b] = '\0';
  ss.__ss_padding[0x1c] = '\0';
  ss.__ss_padding[0x1d] = '\0';
  ss.__ss_padding[6] = '\0';
  ss.__ss_padding[7] = '\0';
  ss.__ss_padding[8] = '\0';
  ss.__ss_padding[9] = '\0';
  ss.__ss_padding[10] = '\0';
  ss.__ss_padding[0xb] = '\0';
  ss.__ss_padding[0xc] = '\0';
  ss.__ss_padding[0xd] = '\0';
  if (s_use_ipv6_) {
    ss.__ss_padding._6_8_ = _in6addr_any;
    ss.__ss_padding._14_8_ = _pthread_rwlock_wrlock;
    __len_00 = 0x1c;
    ss.ss_family = 10;
  }
  else {
    __len_00 = 0x10;
    ss.ss_family = 2;
  }
  uVar2 = (ushort)__addr << 8 | (ushort)__addr >> 8;
  ss.__ss_padding[0] = (char)uVar2;
  ss.__ss_padding[1] = (char)(uVar2 >> 8);
  ss.__ss_padding[2] = '\0';
  ss.__ss_padding[3] = '\0';
  ss.__ss_padding[4] = '\0';
  ss.__ss_padding[5] = '\0';
  iVar1 = ::bind(__fd,(sockaddr *)&ss,__len_00);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool
XmlRpcSocket::bind(int fd, int port)
{
  sockaddr_storage ss;
  socklen_t ss_len;
  memset(&ss, 0, sizeof(ss));

  if (s_use_ipv6_)
  {
    sockaddr_in6 *address = (sockaddr_in6 *)&ss;
    ss_len = sizeof(sockaddr_in6);

    address->sin6_family = AF_INET6;
    address->sin6_addr = in6addr_any;
    address->sin6_port = htons((u_short) port);
  }
  else
  {
    sockaddr_in *address = (sockaddr_in *)&ss;
    ss_len = sizeof(sockaddr_in);

    address->sin_family = AF_INET;
    address->sin_addr.s_addr = htonl(INADDR_ANY);
    address->sin_port = htons((u_short) port);
  }

  return (::bind(fd, (sockaddr*)&ss, ss_len) == 0);
}